

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::HinOutTestIO(HinOut *this,HModel *ptr)

{
  getData(this,ptr);
  writeDataColumnWise(this);
  readDataColumnWise(this);
  setData(this,ptr);
  compareData(this,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," DATA IS THE SAME",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void HinOut::HinOutTestIO(HModel & ptr) {

	HinOutTestWrite(ptr);
	//clearData();
	HinOutTestRead(ptr);

	compareData(2); cout<<" DATA IS THE SAME"<<endl;
}